

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O2

wchar_t archive_read_disk_open(archive *_a,char *pathname)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x21,"archive_read_disk_open");
  if (iVar1 == -0x1e) {
    return L'\xffffffe2';
  }
  archive_clear_error(_a);
  wVar2 = _archive_read_disk_open(_a,pathname);
  return wVar2;
}

Assistant:

static int
_archive_read_disk_open(struct archive *_a, const char *pathname)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;

	if (a->tree != NULL)
		a->tree = tree_reopen(a->tree, pathname,
		    a->flags & ARCHIVE_READDISK_RESTORE_ATIME);
	else
		a->tree = tree_open(pathname, a->symlink_mode,
		    a->flags & ARCHIVE_READDISK_RESTORE_ATIME);
	if (a->tree == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate tar data");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}
	a->archive.state = ARCHIVE_STATE_HEADER;

	return (ARCHIVE_OK);
}